

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzer.cpp
# Opt level: O1

void __thiscall HdmiCecAnalyzer::HdmiCecAnalyzer(HdmiCecAnalyzer *this)

{
  HdmiCecAnalyzerSettings *this_00;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__HdmiCecAnalyzer_0010eca8;
  this_00 = (HdmiCecAnalyzerSettings *)operator_new(0x28);
  HdmiCecAnalyzerSettings::HdmiCecAnalyzerSettings(this_00);
  (this->mSettings)._M_ptr = this_00;
  (this->mResults)._M_ptr = (HdmiCecAnalyzerResults *)0x0;
  HdmiCecSimulationDataGenerator::HdmiCecSimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

HdmiCecAnalyzer::HdmiCecAnalyzer() : Analyzer2(), mSettings( new HdmiCecAnalyzerSettings() ), mSimulationInitilized( false )
{
    SetAnalyzerSettings( mSettings.get() );
}